

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O0

void __thiscall Amiga::Chipset::output<12>(Chipset *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int iVar6;
  byte local_71;
  bool is_pixel_display;
  int midline;
  int blank3;
  int burst;
  int blank2;
  int sync;
  int blank1;
  int end_of_pixels;
  size_t c;
  int dcycle;
  Chipset *this_local;
  
  Audio::output(&this->audio_);
  for (_blank1 = 0; sVar3 = std::array<Amiga::Sprite,_8UL>::size(&this->sprites_), _blank1 < sVar3;
      _blank1 = _blank1 + 2) {
    pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1);
    if ((((pvVar4->visible & 1U) != 0) &&
        (pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1),
        0x17 < pvVar4->h_start)) &&
       (pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1),
       pvVar4->h_start < 0x1a)) {
      pvVar5 = std::array<Amiga::TwoSpriteShifter,_4UL>::operator[]
                         (&this->sprite_shifters_,_blank1 >> 1);
      pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1);
      uVar1 = pvVar4->data[1];
      pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1);
      uVar2 = pvVar4->data[0];
      pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1);
      TwoSpriteShifter::load<0>(pvVar5,uVar1,uVar2,pvVar4->h_start & 1);
    }
    pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1 + 1);
    if ((((pvVar4->visible & 1U) != 0) &&
        (pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1 + 1),
        0x17 < pvVar4->h_start)) &&
       (pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1 + 1),
       pvVar4->h_start < 0x1a)) {
      pvVar5 = std::array<Amiga::TwoSpriteShifter,_4UL>::operator[]
                         (&this->sprite_shifters_,_blank1 >> 1);
      pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1 + 1);
      uVar1 = pvVar4->data[1];
      pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1 + 1);
      uVar2 = pvVar4->data[0];
      pvVar4 = std::array<Amiga::Sprite,_8UL>::operator[](&this->sprites_,_blank1 + 1);
      TwoSpriteShifter::load<1>(pvVar5,uVar1,uVar2,pvVar4->h_start & 1);
    }
  }
  if (this->y_ < this->vertical_blank_height_) {
    iVar6 = this->vertical_blank_height_ >> 1;
    if ((this->is_long_field_ & 1U) == 0) {
      if ((this->y_ < iVar6 + -1) || (iVar6 + 1 < this->y_)) {
        if (this->line_length_ == 0xd) {
          Outputs::CRT::CRT::output_blank(&this->crt_,(this->line_length_ + -0x24) * 4);
        }
      }
      else if (this->line_length_ == 0xd) {
        Outputs::CRT::CRT::output_sync(&this->crt_,(this->line_length_ + -0x24) * 4);
      }
    }
    else if ((this->y_ < iVar6 + -1) || (iVar6 + 2 < this->y_)) {
      if (this->line_length_ == 0xd) {
        Outputs::CRT::CRT::output_blank(&this->crt_,(this->line_length_ + -0x24) * 4);
      }
    }
    else if (this->y_ == iVar6 + -1) {
      if (this->line_length_ == 0xd) {
        Outputs::CRT::CRT::output_sync(&this->crt_,(this->line_length_ + -0x72) * 4);
      }
    }
    else if (this->y_ == iVar6 + 2) {
      if (this->line_length_ == 0xd) {
        Outputs::CRT::CRT::output_blank(&this->crt_,(this->line_length_ + -0x72) * 4);
      }
    }
    else if (this->line_length_ == 0xd) {
      Outputs::CRT::CRT::output_sync(&this->crt_,(this->line_length_ + -0x24) * 4);
    }
  }
  else {
    this->display_horizontal_ =
         (this->display_horizontal_ & 1U) != 0 ||
         (int)(uint)this->display_window_start_[0] >> 1 == 0xc;
    this->display_horizontal_ =
         (this->display_horizontal_ & 1U & (int)(uint)this->display_window_stop_[0] >> 1 != 0xc) !=
         0;
    local_71 = 0;
    if ((this->display_horizontal_ & 1U) != 0) {
      local_71 = this->fetch_vertical_;
    }
    local_71 = local_71 & 1;
    if ((local_71 == (this->is_border_ & 1U)) ||
       (((this->is_border_ & 1U) != 0 && (this->border_colour_ != this->palette_[0])))) {
      flush_output(this);
      this->is_border_ = (bool)((local_71 ^ 0xff) & 1);
      this->border_colour_ = this->palette_[0];
    }
    if (local_71 != 0) {
      output_pixels(this,this->line_length_ + 3);
    }
    this->zone_duration_ = this->zone_duration_ + 1;
  }
  BitplaneShifter::shift(&this->bitplane_pixels_,(bool)(this->is_high_res_ & 1));
  pvVar5 = std::array<Amiga::TwoSpriteShifter,_4UL>::operator[](&this->sprite_shifters_,0);
  TwoSpriteShifter::shift(pvVar5);
  pvVar5 = std::array<Amiga::TwoSpriteShifter,_4UL>::operator[](&this->sprite_shifters_,1);
  TwoSpriteShifter::shift(pvVar5);
  pvVar5 = std::array<Amiga::TwoSpriteShifter,_4UL>::operator[](&this->sprite_shifters_,2);
  TwoSpriteShifter::shift(pvVar5);
  pvVar5 = std::array<Amiga::TwoSpriteShifter,_4UL>::operator[](&this->sprite_shifters_,3);
  TwoSpriteShifter::shift(pvVar5);
  return;
}

Assistant:

void Chipset::output() {
	// Notes to self on guesses below:
	//
	// Hardware stop is at 0x18;
	// 12/64 * 227 = 42.5625
	//
	// "However, horizontal blanking actually limits the displayable
	// video to 368 low resolution pixel"
	//
	// => 184 windows out of 227 are visible, which concurs.

	// TODO: Reload bitplanes if anything is pending.
//	if(has_next_bitplanes_) {
//		has_next_bitplanes_ = false;
//		bitplane_pixels_.set(
//			previous_bitplanes_,
//			next_bitplanes_,
//			odd_delay_,
//			even_delay_
//		);
//		previous_bitplanes_ = next_bitplanes_;
//	}

	// Advance audio.
	audio_.output();

	// Trigger any sprite loads encountered.
	constexpr auto dcycle = cycle << 1;
	static_assert(std::tuple_size<decltype(sprites_)>::value % 2 == 0);
	for(size_t c = 0; c < sprites_.size(); c += 2) {
		if( sprites_[c].visible &&
			dcycle <= sprites_[c].h_start &&
			dcycle+2 > sprites_[c].h_start) {
			sprite_shifters_[c >> 1].load<0>(
				sprites_[c].data[1],
				sprites_[c].data[0],
				sprites_[c].h_start & 1);
		}

		if(	sprites_[c+1].visible &&
			dcycle <= sprites_[c + 1].h_start &&
			dcycle+2 > sprites_[c + 1].h_start) {
			sprite_shifters_[c >> 1].load<1>(
				sprites_[c + 1].data[1],
				sprites_[c + 1].data[0],
				sprites_[c + 1].h_start & 1);
		}
	}

	//
	// Horizontal sync: HC18–HC35;
	// Horizontal blank: HC15–HC53.
	//
	// Beyond that: guesswork.
	//
	// So, from cycle 0:
	//
	//	15 cycles border/pixels;
	//	3 cycles blank;
	//	17 cycles sync;
	//	3 cycles blank;
	//	9 cycles colour burst;
	//	6 cycles blank;
	//	then more border/pixels to end of line.
	//
	// (???)

	constexpr int end_of_pixels	= 15;
	constexpr int blank1		= 3 + end_of_pixels;
	constexpr int sync			= 17 + blank1;
	constexpr int blank2		= 3 + sync;
	constexpr int burst			= 9 + blank2;
	constexpr int blank3		= 6 + burst;
	static_assert(blank3 == 53);

#define LINK(location, action, length)	\
	if(cycle == (location))	{			\
		crt_.action((length) * 4);		\
	}

	if(y_ < vertical_blank_height_) {
		if(!cycle) {
			flush_output();
		}

		// Put three lines of sync at the centre of the vertical blank period.
		// Offset by half a line if interlaced and on an odd frame.
		const int midline = vertical_blank_height_ >> 1;
		if(is_long_field_) {
			if(y_ < midline - 1 || y_ > midline + 2) {
				LINK(blank1, output_blank, blank1);
				LINK(sync, output_sync, sync - blank1);
				LINK(line_length_ - 1, output_blank, line_length_ - 1 - sync);
			} else if(y_ == midline - 1) {
				LINK(113, output_blank, 113);
				LINK(line_length_ - 1, output_sync, line_length_ - 1 - 113);
			} else if(y_ == midline + 2) {
				LINK(113, output_sync, 113);
				LINK(line_length_ - 1, output_blank, line_length_ - 1 - 113);
			} else {
				LINK(blank1, output_sync, blank1);
				LINK(sync, output_blank, sync - blank1);
				LINK(line_length_ - 1, output_sync, line_length_ - 1 - sync);
			}
		} else {
			if(y_ < midline - 1 || y_ > midline + 1) {
				LINK(blank1, output_blank, blank1);
				LINK(sync, output_sync, sync - blank1);
				LINK(line_length_ - 1, output_blank, line_length_ - 1 - sync);
			} else {
				LINK(blank1, output_sync, blank1);
				LINK(sync, output_blank, sync - blank1);
				LINK(line_length_ - 1, output_sync, line_length_ - 1 - sync);
			}
		}
	} else {
		// TODO: incorporate the lowest display window bits elsewhere.
		display_horizontal_ |= cycle == (display_window_start_[0] >> 1);
		display_horizontal_ &= cycle != (display_window_stop_[0] >> 1);

		if(cycle == end_of_pixels) {
			flush_output();
		}

		// Output the correct sequence of blanks, syncs and burst atomically.
		LINK(blank1, output_blank, blank1 - end_of_pixels);
		LINK(sync, output_sync, sync - blank1);
		LINK(blank2, output_blank, blank2 - sync);
		LINK(burst, output_default_colour_burst, burst - blank2);	// TODO: only if colour enabled.
		LINK(blank3, output_blank, blank3 - burst);

		if constexpr (cycle < end_of_pixels || cycle > blank3) {
			const bool is_pixel_display = display_horizontal_ && fetch_vertical_;

			if(
				(is_pixel_display == is_border_) ||
				(is_border_ && border_colour_ != palette_[0])) {
				flush_output();

				is_border_ = !is_pixel_display;
				border_colour_ = palette_[0];
			}

			if(is_pixel_display) {
				// This is factored out because it is fairly convoluted and is not a function of
				// the template parameter; I doubt I'm somehow being smarter than the optimising
				// compiler, but this makes my debugging life a lot easier and I don't imagine
				// the compiler will do a worse job.
				output_pixels(line_length_ + end_of_pixels - cycle);
			}
			++zone_duration_;
		}
	}
#undef LINK

	// Update all active pixel shifters.
	bitplane_pixels_.shift(is_high_res_);
	sprite_shifters_[0].shift();
	sprite_shifters_[1].shift();
	sprite_shifters_[2].shift();
	sprite_shifters_[3].shift();
}